

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

bool wasm::String::wildcardMatch(string *pattern,string *value)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  bool bVar6;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  uVar2 = pattern->_M_string_length;
  bVar6 = uVar2 != 0;
  if (bVar6) {
    sVar5 = 0;
    do {
      cVar1 = (pattern->_M_dataplus)._M_p[sVar5];
      if (cVar1 == '*') {
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)pattern);
        std::__cxx11::string::substr((ulong)&local_90,(ulong)value);
        bVar3 = wildcardMatch(&local_b0,&local_90);
        if (bVar3) {
          bVar4 = true;
          bVar3 = false;
        }
        else if (value->_M_string_length == 0) {
          bVar3 = false;
          bVar4 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)pattern);
          std::__cxx11::string::substr((ulong)&local_50,(ulong)value);
          bVar4 = wildcardMatch(&local_70,&local_50);
          bVar3 = true;
        }
        if (bVar3) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0066458d;
      }
      if ((value->_M_string_length == sVar5) || (cVar1 != (value->_M_dataplus)._M_p[sVar5])) break;
      sVar5 = sVar5 + 1;
      bVar6 = sVar5 < uVar2;
    } while (sVar5 != uVar2);
  }
  bVar4 = false;
LAB_0066458d:
  if (!bVar6) {
    bVar4 = value->_M_string_length == pattern->_M_string_length;
  }
  return bVar4;
}

Assistant:

inline bool wildcardMatch(const std::string& pattern,
                          const std::string& value) {
  for (size_t i = 0; i < pattern.size(); i++) {
    if (pattern[i] == '*') {
      return wildcardMatch(pattern.substr(i + 1), value.substr(i)) ||
             (value.size() > 0 &&
              wildcardMatch(pattern.substr(i), value.substr(i + 1)));
    }
    if (i >= value.size()) {
      return false;
    }
    if (pattern[i] != value[i]) {
      return false;
    }
  }
  return value.size() == pattern.size();
}